

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_suite.cpp
# Opt level: O1

void __thiscall reader_url_suite::test_path_abempty_two::test_method(test_path_abempty_two *this)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  view_type local_380;
  uint *local_370;
  undefined **local_368;
  undefined1 local_360;
  undefined8 *local_358;
  uint **local_350;
  view_type local_348;
  undefined8 *local_338;
  size_t *local_330;
  undefined **local_328;
  undefined1 local_320;
  undefined8 *local_318;
  char *local_310;
  undefined1 local_308 [8];
  undefined8 local_300;
  shared_count sStack_2f8;
  char *local_2f0;
  char *local_2e8;
  url reader;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  char input [30];
  
  local_348.ptr_ = input;
  builtin_strncpy(input + 0x10,".com/path/two",0xe);
  builtin_strncpy(input,"scheme://example",0x10);
  local_348.len_ = strlen(local_348.ptr_);
  trial::url::reader::basic_url<char>::basic_url(&reader,&local_348);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_68,0x8a);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_380.len_ = (size_t)&local_380;
  local_380.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_370 = (uint *)((long)&local_380.ptr_ + 4);
  local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token == scheme;
  local_380.ptr_._4_4_ = 2;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_330 = &local_380.len_;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_360 = 0;
  local_350 = &local_370;
  local_368 = &PTR__lazy_ostream_00186618;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_88 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x8b);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 6) {
    iVar3 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"scheme",6
                );
    local_308[0] = iVar3 == 0;
  }
  else {
    local_308[0] = false;
  }
  local_330 = &local_380.len_;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_370 = (uint *)0x16fe2f;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186358;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8b,2,2,2,"reader.literal()",&local_348,"\"scheme\"",
             &local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0x8c);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_380.ptr_._0_4_ = CONCAT31(local_380.ptr_._1_3_,local_308[0]);
  local_380.ptr_._4_4_ = CONCAT31(local_380.ptr_._5_3_,1);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_370 = (uint *)((long)&local_380.ptr_ + 4);
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_001865d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_380.len_ = (size_t)&local_380;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8c,2,2,2,"reader.next()",&local_348,"true",&local_368
            );
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c8,0x8d);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 authority_host_name;
  local_380.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_380.ptr_._4_4_ = 4;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_370 = (uint *)((long)&local_380.ptr_ + 4);
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186618;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_380.len_ = (size_t)&local_380;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8d,2,2,2,"reader.subcode()",&local_348,
             "url::token::subcode::authority_host_name",&local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x8e);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 0xb) {
    iVar3 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,
                 "example.com",0xb);
    local_308[0] = iVar3 == 0;
  }
  else {
    local_308[0] = false;
  }
  local_330 = &local_380.len_;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_370 = (uint *)0x16f1f0;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186458;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8e,2,2,2,"reader.literal()",&local_348,
             "\"example.com\"",&local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x8f);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_380.ptr_._0_4_ = CONCAT31(local_380.ptr_._1_3_,local_308[0]);
  local_380.ptr_._4_4_ = CONCAT31(local_380.ptr_._5_3_,1);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  puVar1 = (uint *)((long)&local_380.ptr_ + 4);
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_001865d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x8f,2,2,2,"reader.next()",&local_348,"true",&local_368
            );
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_128,0x90);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_380.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::category
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_380.ptr_._4_4_ = 3;
  local_308[0] = (value)local_380.ptr_ == path;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186518;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x90,2,2,2,"reader.category()",&local_348,
             "url::token::category::path",&local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x91);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_380.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_380.ptr_._4_4_ = 6;
  local_308[0] = (value)local_380.ptr_ == path_segment;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186558;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x91,2,2,2,"reader.code()",&local_348,
             "url::token::code::path_segment",&local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_168 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x92);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_380.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_380.ptr_._4_4_ = 8;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_370 = (uint *)((long)&local_380.ptr_ + 4);
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186618;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x92,2,2,2,"reader.subcode()",&local_348,
             "url::token::subcode::path_segment",&local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_188 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_188,0x93);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 4) {
    iVar3 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"path",4);
    local_308[0] = iVar3 == 0;
  }
  else {
    local_308[0] = false;
  }
  local_330 = &local_380.len_;
  puVar1 = (uint *)((long)&local_380.ptr_ + 4);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_370 = (uint *)0x16ffdb;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186698;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x93,2,2,2,"reader.literal()",&local_348,"\"path\"",
             &local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_1a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x94);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = trial::url::reader::basic_url<char>::do_next(&reader);
  local_380.ptr_._0_4_ = CONCAT31(local_380.ptr_._1_3_,local_308[0]);
  local_380.ptr_._4_4_ = CONCAT31(local_380.ptr_._5_3_,1);
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_001865d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x94,2,2,2,"reader.next()",&local_348,"true",&local_368
            );
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x95);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_380.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::category
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_380.ptr_._4_4_ = 3;
  local_308[0] = (value)local_380.ptr_ == path;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186518;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186518;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x95,2,2,2,"reader.category()",&local_348,
             "url::token::category::path",&local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e8,0x96);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_380.ptr_._0_4_ =
       trial::url::reader::base<char,_trial::url::reader::basic_url>::code
                 (&reader.super_base<char,_trial::url::reader::basic_url>);
  local_380.ptr_._4_4_ = 6;
  local_308[0] = (value)local_380.ptr_ == path_segment;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186558;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186558;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x96,2,2,2,"reader.code()",&local_348,
             "url::token::code::path_segment",&local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x97);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  local_308[0] = reader.super_base<char,_trial::url::reader::basic_url>.current_token ==
                 path_segment;
  local_380.ptr_._0_4_ = reader.super_base<char,_trial::url::reader::basic_url>.current_token;
  local_380.ptr_._4_4_ = 8;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186618;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_00186618;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x97,2,2,2,"reader.subcode()",&local_348,
             "url::token::subcode::path_segment",&local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x98);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  if (reader.super_base<char,_trial::url::reader::basic_url>.current_view.len_ == 3) {
    iVar3 = bcmp(reader.super_base<char,_trial::url::reader::basic_url>.current_view.ptr_,"two",3);
    local_308[0] = iVar3 == 0;
  }
  else {
    local_308[0] = false;
  }
  local_330 = &local_380.len_;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&reader.super_base<char,_trial::url::reader::basic_url>.current_view;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_00186598;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_370 = (uint *)0x173e40;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_001866d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x98,2,2,2,"reader.literal()",&local_348,"\"two\"",
             &local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_240 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x99);
  local_320 = 0;
  local_328 = &PTR__lazy_ostream_00186260;
  local_318 = &boost::unit_test::lazy_ostream::inst;
  local_310 = "";
  bVar2 = trial::url::reader::basic_url<char>::do_next(&reader);
  local_380.ptr_._0_4_ = CONCAT31(local_380.ptr_._1_3_,bVar2);
  local_380.ptr_._4_4_ = local_380.ptr_._4_4_ & 0xffffff00;
  local_308[0] = !bVar2;
  local_300 = 0;
  sStack_2f8.pi_ = (sp_counted_base *)0x0;
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/reader/url_suite.cpp";
  local_2e8 = "";
  local_380.len_ = (size_t)&local_380;
  local_348.len_ = local_348.len_ & 0xffffffffffffff00;
  local_348.ptr_ = (char *)&PTR__lazy_ostream_001865d8;
  local_338 = &boost::unit_test::lazy_ostream::inst;
  local_330 = &local_380.len_;
  local_360 = 0;
  local_368 = &PTR__lazy_ostream_001865d8;
  local_358 = &boost::unit_test::lazy_ostream::inst;
  local_350 = &local_370;
  local_370 = puVar1;
  boost::test_tools::tt_detail::report_assertion
            (local_308,&local_328,&local_2f0,0x99,2,2,2,"reader.next()",&local_348,"false",
             &local_368);
  boost::detail::shared_count::~shared_count(&sStack_2f8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_path_abempty_two)
{
    const char input[] = "scheme://example.com/path/two";
    url::reader::url reader(input);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::scheme);
    BOOST_REQUIRE_EQUAL(reader.literal(), "scheme");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::authority_host_name);
    BOOST_REQUIRE_EQUAL(reader.literal(), "example.com");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "path");
    BOOST_REQUIRE_EQUAL(reader.next(), true);
    BOOST_REQUIRE_EQUAL(reader.category(), url::token::category::path);
    BOOST_REQUIRE_EQUAL(reader.code(), url::token::code::path_segment);
    BOOST_REQUIRE_EQUAL(reader.subcode(), url::token::subcode::path_segment);
    BOOST_REQUIRE_EQUAL(reader.literal(), "two");
    BOOST_REQUIRE_EQUAL(reader.next(), false);
}